

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

Status cmsys::SystemTools::MakeDirectory(char *path,mode_t *mode)

{
  allocator<char> local_41;
  string local_40;
  mode_t *local_20;
  mode_t *mode_local;
  char *path_local;
  
  local_20 = mode;
  mode_local = (mode_t *)path;
  if (path == (char *)0x0) {
    path_local = (char *)Status::POSIX(0x16);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,path,&local_41);
    path_local = (char *)MakeDirectory(&local_40,local_20);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  return (Status)path_local;
}

Assistant:

Status SystemTools::MakeDirectory(const char* path, const mode_t* mode)
{
  if (!path) {
    return Status::POSIX(EINVAL);
  }
  return SystemTools::MakeDirectory(std::string(path), mode);
}